

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

void __thiscall Catch::TeamCityReporter::printSectionHeader(TeamCityReporter *this,ostream *os)

{
  pointer pSVar1;
  char cVar2;
  size_t sVar3;
  long lVar4;
  pointer text;
  SourceLineInfo lineInfo;
  char local_81;
  TeamCityReporter *local_80;
  Column local_78;
  
  cVar2 = (char)os;
  if (1 < (ulong)(((long)(this->super_StreamingReporterBase).m_sectionStack.
                         super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->super_StreamingReporterBase).m_sectionStack.
                         super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555)) {
    lVar4 = 0x4f;
    do {
      std::ostream::put(cVar2);
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
    local_78.m_string.m_string._M_dataplus._M_p._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_78,1);
    pSVar1 = (this->super_StreamingReporterBase).m_sectionStack.
             super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
             super__Vector_impl_data._M_finish;
    text = (this->super_StreamingReporterBase).m_sectionStack.
           super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
           super__Vector_impl_data._M_start + 1;
    local_80 = this;
    if (text != pSVar1) {
      do {
        lVar4 = std::__cxx11::string::find((char *)text,0x180448,0);
        sVar3 = lVar4 + 2;
        if (lVar4 == -1) {
          sVar3 = 0;
        }
        TextFlow::Column::Column(&local_78,&text->name);
        local_78.m_initialIndent = 0;
        local_78.m_indent = sVar3;
        TextFlow::operator<<(os,&local_78);
        local_81 = '\n';
        std::__ostream_insert<char,std::char_traits<char>>(os,&local_81,1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78.m_string.m_string._M_dataplus._M_p != &local_78.m_string.m_string.field_2) {
          operator_delete(local_78.m_string.m_string._M_dataplus._M_p,
                          local_78.m_string.m_string.field_2._M_allocated_capacity + 1);
        }
        text = text + 1;
      } while (text != pSVar1);
    }
    lVar4 = 0x4f;
    do {
      std::ostream::put(cVar2);
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
    local_78.m_string.m_string._M_dataplus._M_p._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_78,1);
    this = local_80;
  }
  pSVar1 = (this->super_StreamingReporterBase).m_sectionStack.
           super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_78.m_string.m_string._M_dataplus._M_p = (pSVar1->lineInfo).file;
  local_78.m_string.m_string._M_string_length = (pSVar1->lineInfo).line;
  operator<<(os,(SourceLineInfo *)&local_78);
  local_81 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(os,&local_81,1);
  lVar4 = 0x4f;
  do {
    std::ostream::put(cVar2);
    lVar4 = lVar4 + -1;
  } while (lVar4 != 0);
  std::__ostream_insert<char,std::char_traits<char>>(os,"\n\n",2);
  return;
}

Assistant:

void TeamCityReporter::printSectionHeader(std::ostream& os) {
        assert(!m_sectionStack.empty());

        if (m_sectionStack.size() > 1) {
            os << lineOfChars('-') << '\n';

            std::vector<SectionInfo>::const_iterator
                it = m_sectionStack.begin() + 1, // Skip first section (test case)
                itEnd = m_sectionStack.end();
            for (; it != itEnd; ++it)
                printHeaderString(os, it->name);
            os << lineOfChars('-') << '\n';
        }

        SourceLineInfo lineInfo = m_sectionStack.front().lineInfo;

        os << lineInfo << '\n';
        os << lineOfChars('.') << "\n\n";
    }